

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

UCVarValue FBaseCVar::FromString(char *value,ECVarType type)

{
  char *pcVar1;
  GUID *pGVar2;
  int iVar3;
  GUID *in_RAX;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  UCVarValue ret;
  undefined8 local_18;
  
  local_18._4_4_ = (uint)((ulong)in_RAX >> 0x20);
  pGVar2 = in_RAX;
  switch(type) {
  case CVAR_Bool:
    iVar3 = strcasecmp(value,"true");
    local_18._1_7_ = (uint7)((ulong)in_RAX >> 8);
    if (iVar3 == 0) {
      local_18 = (GUID *)CONCAT71(local_18._1_7_,1);
      pGVar2 = local_18;
    }
    else {
      iVar3 = strcasecmp(value,"false");
      if (iVar3 == 0) {
        local_18 = (GUID *)((ulong)local_18._1_7_ << 8);
        pGVar2 = local_18;
      }
      else {
        lVar4 = strtol(value,(char **)0x0,0);
        local_18 = (GUID *)CONCAT71(local_18._1_7_,lVar4 != 0);
        pGVar2 = local_18;
      }
    }
    break;
  case CVAR_Int:
    iVar3 = strcasecmp(value,"true");
    if (iVar3 == 0) {
      local_18 = (GUID *)CONCAT44(local_18._4_4_,1);
      pGVar2 = local_18;
    }
    else {
      iVar3 = strcasecmp(value,"false");
      if (iVar3 == 0) {
        local_18 = (GUID *)((ulong)local_18._4_4_ << 0x20);
        pGVar2 = local_18;
      }
      else {
        lVar4 = strtol(value,(char **)0x0,0);
        local_18 = (GUID *)CONCAT44(local_18._4_4_,(int)lVar4);
        pGVar2 = local_18;
      }
    }
    break;
  case CVAR_Float:
    dVar7 = strtod(value,(char **)0x0);
    local_18 = (GUID *)CONCAT44(local_18._4_4_,(float)dVar7);
    pGVar2 = local_18;
    break;
  case CVAR_String:
    pGVar2 = (GUID *)value;
    break;
  case CVAR_GUID:
    local_18 = (GUID *)0x0;
    pGVar2 = local_18;
    if (value != (char *)0x0) {
      uVar6 = 0;
      do {
        pcVar1 = value + uVar6;
        uVar5 = uVar6 + 1;
        if (0x25 < uVar6) break;
        uVar6 = uVar5;
      } while (*pcVar1 != '\0');
      if (*pcVar1 == '\0' && uVar5 == 0x27) {
        uVar6 = strtoul(value + 1,(char **)0x0,0x10);
        cGUID.Data1 = (DWORD)uVar6;
        uVar6 = strtoul(value + 10,(char **)0x0,0x10);
        cGUID.Data2 = (WORD)uVar6;
        uVar6 = strtoul(value + 0xf,(char **)0x0,0x10);
        cGUID.Data3 = (WORD)uVar6;
        cGUID.Data4[0] = HexToByte(value + 0x14);
        cGUID.Data4[1] = HexToByte(value + 0x16);
        cGUID.Data4[2] = HexToByte(value + 0x19);
        cGUID.Data4[3] = HexToByte(value + 0x1b);
        cGUID.Data4[4] = HexToByte(value + 0x1d);
        cGUID.Data4[5] = HexToByte(value + 0x1f);
        cGUID.Data4[6] = HexToByte(value + 0x21);
        cGUID.Data4[7] = HexToByte(value + 0x23);
        local_18 = &cGUID;
        pGVar2 = local_18;
      }
    }
  }
  local_18 = pGVar2;
  return (UCVarValue)local_18.String;
}

Assistant:

UCVarValue FBaseCVar::FromString (const char *value, ECVarType type)
{
	UCVarValue ret;
	int i;

	switch (type)
	{
	case CVAR_Bool:
		if (stricmp (value, "true") == 0)
			ret.Bool = true;
		else if (stricmp (value, "false") == 0)
			ret.Bool = false;
		else
			ret.Bool = strtol (value, NULL, 0) != 0;
		break;

	case CVAR_Int:
		if (stricmp (value, "true") == 0)
			ret.Int = 1;
		else if (stricmp (value, "false") == 0)
			ret.Int = 0;
		else
			ret.Int = strtol (value, NULL, 0);
		break;

	case CVAR_Float:
		ret.Float = (float)strtod (value, NULL);
		break;

	case CVAR_String:
		ret.String = const_cast<char *>(value);
		break;

	case CVAR_GUID:
		// {xxxxxxxx-xxxx-xxxx-xxxx-xxxxxxxxxxxx}
		// 01234567890123456789012345678901234567
		// 0         1         2         3

		ret.pGUID = NULL;
		if (value == NULL)
		{
			break;
		}
		for (i = 0; value[i] != 0 && i < 38; i++)
		{
			switch (i)
			{
			case 0:
				if (value[i] != '{')
					break;
			case 9:
			case 14:
			case 19:
			case 24:
				if (value[i] != '-')
					break;
			case 37:
				if (value[i] != '}')
					break;
			default:
				if (value[i] < '0' || 
					(value[i] > '9' && value[i] < 'A') || 
					(value[i] > 'F' && value[i] < 'a') || 
					value[i] > 'f')
					break;
			}
		}
		if (i == 38 && value[i] == 0)
		{
			cGUID.Data1 = strtoul (value + 1, NULL, 16);
			cGUID.Data2 = (WORD)strtoul (value + 10, NULL, 16);
			cGUID.Data3 = (WORD)strtoul (value + 15, NULL, 16);
			cGUID.Data4[0] = HexToByte (value + 20);
			cGUID.Data4[1] = HexToByte (value + 22);
			cGUID.Data4[2] = HexToByte (value + 25);
			cGUID.Data4[3] = HexToByte (value + 27);
			cGUID.Data4[4] = HexToByte (value + 29);
			cGUID.Data4[5] = HexToByte (value + 31);
			cGUID.Data4[6] = HexToByte (value + 33);
			cGUID.Data4[7] = HexToByte (value + 35);
			ret.pGUID = &cGUID;
		}
		break;

	default:
		break;
	}

	return ret;
}